

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O0

void __thiscall
TileWire::_addNextTile
          (TileWire *this,Tile *nextTile,Direction direction,State *state,FollowWireStage *stage)

{
  bool bVar1;
  Direction DVar2;
  State SVar3;
  int iVar4;
  State *in_RCX;
  Direction in_EDX;
  TileWire *in_RSI;
  Tile *in_RDI;
  State gateNextState;
  TileGate *nextGate;
  bool wireUpdated;
  TileWire *nextWire;
  value_type *in_stack_ffffffffffffff48;
  TileWire *in_stack_ffffffffffffff50;
  type_info *in_stack_ffffffffffffff58;
  TileWire *__arg;
  TileWire *in_stack_ffffffffffffff60;
  TileWire *this_00;
  State in_stack_ffffffffffffff6c;
  TileWire *this_01;
  pair<TileWire_*,_Direction> local_58;
  pair<TileWire_*,_Direction> local_48;
  bool local_31;
  TileWire *local_30 [2];
  State *local_20;
  Direction local_14;
  TileWire *local_10;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  if (in_RSI == (TileWire *)0x0) {
    __cxa_bad_typeid();
  }
  bVar1 = std::type_info::operator==
                    ((type_info *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (bVar1) {
    local_30[0] = local_10;
    if (((&in_RDI[(long)(int)(local_10->super_Tile)._direction * 2].field_0x21)
         [(long)((int)(local_14 + SOUTH) % 4) +
          (long)(int)local_14 * 4 + (long)(int)local_10->_type * 0x10] & 1) != 0) {
      if ((local_10->_type == CROSSOVER) && ((int)local_14 % 2 == 1)) {
        local_31 = local_10->_updateTimestamp2 != Tile::currentUpdateTime;
        if (local_31) {
          local_10->_state2 = *local_20;
          local_10->_updateTimestamp2 = Tile::currentUpdateTime;
        }
      }
      else {
        local_31 = local_10->_updateTimestamp1 != Tile::currentUpdateTime;
        if (local_31) {
          local_10->_state1 = *local_20;
          local_10->_updateTimestamp1 = Tile::currentUpdateTime;
        }
      }
      if (local_31 != false) {
        (*(local_10->super_Tile)._vptr_Tile[8])(local_10,1,0);
        std::pair<TileWire_*,_Direction>::pair<TileWire_*&,_Direction_&,_true>
                  (&local_48,local_30,&local_14);
        std::
        vector<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
        ::push_back((vector<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                     *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        std::pair<TileWire_*,_Direction>::pair<TileWire_*&,_Direction_&,_true>
                  (&local_58,local_30,&local_14);
        std::
        stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
        ::push((stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        Tile::getBoardPtr(in_RDI);
        bVar1 = std::
                unordered_set<TileWire_*,_std::hash<TileWire_*>,_std::equal_to<TileWire_*>,_std::allocator<TileWire_*>_>
                ::empty((unordered_set<TileWire_*,_std::hash<TileWire_*>,_std::equal_to<TileWire_*>,_std::allocator<TileWire_*>_>
                         *)0x1a3ae1);
        if ((!bVar1) &&
           ((local_30[0]->_type != CROSSOVER ||
            (local_30[0]->_updateTimestamp1 == local_30[0]->_updateTimestamp2)))) {
          Tile::getBoardPtr(in_RDI);
          std::
          unordered_set<TileWire_*,_std::hash<TileWire_*>,_std::equal_to<TileWire_*>,_std::allocator<TileWire_*>_>
          ::erase((unordered_set<TileWire_*,_std::hash<TileWire_*>,_std::equal_to<TileWire_*>,_std::allocator<TileWire_*>_>
                   *)in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->first);
        }
      }
    }
  }
  else {
    this_01 = local_10;
    if (local_10 == (TileWire *)0x0) {
      __cxa_bad_typeid();
    }
    bVar1 = std::type_info::operator==
                      ((type_info *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (bVar1) {
      DVar2 = Tile::getDirection(&local_10->super_Tile);
      if ((int)(DVar2 + SOUTH) % 4 == local_14) {
        SVar3 = TileGate::getNextState((TileGate *)local_10);
      }
      else {
        SVar3 = DISCONNECTED;
      }
      if (SVar3 == DISCONNECTED) {
        std::vector<TileGate_*,_std::allocator<TileGate_*>_>::push_back
                  ((vector<TileGate_*,_std::allocator<TileGate_*>_> *)in_stack_ffffffffffffff60,
                   (value_type *)in_stack_ffffffffffffff58);
      }
      else if ((Board::enableExtraLogicStates & 1U) == 0) {
        if ((SVar3 == HIGH) && (*local_20 == LOW)) {
          *local_20 = HIGH;
          _fixTraversedWires(this_01,HIGH);
        }
      }
      else {
        _checkForInvalidState
                  (in_stack_ffffffffffffff60,(State)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                   (State *)in_stack_ffffffffffffff50,(FollowWireStage *)in_stack_ffffffffffffff48);
      }
    }
    else {
      this_00 = local_10;
      if (local_10 == (TileWire *)0x0) {
        __cxa_bad_typeid();
      }
      bVar1 = std::type_info::operator==((type_info *)this_00,in_stack_ffffffffffffff58);
      if (bVar1) {
        std::vector<TileLED_*,_std::allocator<TileLED_*>_>::push_back
                  ((vector<TileLED_*,_std::allocator<TileLED_*>_> *)in_stack_ffffffffffffff50,
                   (value_type *)in_stack_ffffffffffffff48);
      }
      else {
        __arg = local_10;
        if (local_10 == (TileWire *)0x0) {
          __cxa_bad_typeid();
        }
        bVar1 = std::type_info::operator==((type_info *)this_00,(type_info *)__arg);
        if (!bVar1) {
          in_stack_ffffffffffffff50 = local_10;
          if (local_10 == (TileWire *)0x0) {
            __cxa_bad_typeid();
          }
          bVar1 = std::type_info::operator==((type_info *)this_00,(type_info *)__arg);
          if (!bVar1) {
            return;
          }
        }
        SVar3 = (State)((ulong)__arg >> 0x20);
        if ((Board::enableExtraLogicStates & 1U) == 0) {
          iVar4 = (*(code *)(((deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                               *)&local_10->super_Tile)->
                            super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                            )._M_impl.super__Deque_impl_data._M_map[2])();
          if ((iVar4 == 2) && (*local_20 == LOW)) {
            *local_20 = HIGH;
            _fixTraversedWires(this_01,in_stack_ffffffffffffff6c);
          }
        }
        else {
          (*(code *)(((deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                       *)&local_10->super_Tile)->
                    super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                    )._M_impl.super__Deque_impl_data._M_map[2])();
          _checkForInvalidState
                    (this_00,SVar3,(State *)in_stack_ffffffffffffff50,
                     (FollowWireStage *)in_stack_ffffffffffffff48);
        }
      }
    }
  }
  return;
}

Assistant:

void TileWire::_addNextTile(Tile* nextTile, Direction direction, State& state, FollowWireStage& stage) const {
    if (typeid(*nextTile) == typeid(TileWire)) {    // Check if nextTile is a wire (most common case).
        TileWire* nextWire = static_cast<TileWire*>(nextTile);
        if (CONNECTION_INFO[nextWire->_direction][nextWire->_type][direction][(direction + 2) % 4]) {    // Check if we have a connection back to the source.
            bool wireUpdated = false;
            if (nextWire->_type == CROSSOVER && direction % 2 == 1) {    // Update state of the wire and timestamp if this wire has not been traversed yet.
                if (nextWire->_updateTimestamp2 != Tile::currentUpdateTime) {
                    nextWire->_state2 = state;
                    nextWire->_updateTimestamp2 = Tile::currentUpdateTime;
                    wireUpdated = true;
                }
            } else if (nextWire->_updateTimestamp1 != Tile::currentUpdateTime) {
                nextWire->_state1 = state;
                nextWire->_updateTimestamp1 = Tile::currentUpdateTime;
                wireUpdated = true;
            }
            
            if (wireUpdated) {    // If wire updated in last step, give it a cosmetic update and add it to traversal structures.
                nextWire->addUpdate(true);
                traversedWires.push_back(pair<TileWire*, Direction>(nextWire, direction));
                wireNodes.push(pair<TileWire*, Direction>(nextWire, direction));
                if (!getBoardPtr()->wireUpdates.empty() && (nextWire->_type != CROSSOVER || nextWire->_updateTimestamp1 == nextWire->_updateTimestamp2)) {    // Attempt to remove update if scheduled and wire has been fully updated.
                    getBoardPtr()->wireUpdates.erase(nextWire);
                }
            }
        }
    } else if (typeid(*nextTile) == typeid(TileGate)) {    // Else check if it is a gate.
        TileGate* nextGate = static_cast<TileGate*>(nextTile);
        State gateNextState = (nextGate->getDirection() + 2) % 4 == direction ? nextGate->getNextState() : DISCONNECTED;    // If the gate outputs into previous wire, there may be a state conflict.
        if (gateNextState != DISCONNECTED) {
            if (Board::enableExtraLogicStates) {
                _checkForInvalidState(gateNextState, state, stage);
            } else if (gateNextState == HIGH && state == LOW) {    // If currently LOW and gate outputs HIGH in the next state, conflict found.
                state = HIGH;
                _fixTraversedWires(state);
            }
        } else {    // This gate is an endpoint, no need to check for conflict.
            Board::endpointGates.push_back(nextGate);
        }
    } else if (typeid(*nextTile) == typeid(TileLED)) {    // Else check if it is an LED.
        Board::endpointLEDs.push_back(static_cast<TileLED*>(nextTile));
    } else if (typeid(*nextTile) == typeid(TileSwitch) || typeid(*nextTile) == typeid(TileButton)) {    // Else check if switch/button.
        if (Board::enableExtraLogicStates) {
            _checkForInvalidState(nextTile->getState(), state, stage);
        } else if (nextTile->getState() == HIGH && state == LOW) {    // If currently LOW and switch/button outputs HIGH, conflict found.
            state = HIGH;
            _fixTraversedWires(state);
        }
    }
}